

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase *
EvaluateFunction(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression,ExprBase *context,
                ArrayView<ExprBase_*> arguments)

{
  ExprPointerLiteral *target;
  ExprFunctionDefinition *ctx_00;
  bool bVar1;
  uint uVar2;
  StackFrame *this;
  StackFrame **ppSVar3;
  ExprBase **ppEVar4;
  ExprBase *pEVar5;
  ExprIntegerLiteral *pEVar6;
  ExprBase *result;
  ExprBase *value;
  ExprIntegerLiteral *jmpOffset;
  ExprPointerLiteral *local_80;
  ExprPointerLiteral *storage_1;
  ExprVariableDefinition *curr_1;
  undefined1 local_68 [4];
  uint pos;
  ExprPointerLiteral *local_58;
  ExprPointerLiteral *storage;
  ExprVariableDefinition *curr;
  StackFrame *frame;
  ExprBase *local_38;
  ExprBase *context_local;
  ExprFunctionDefinition *expression_local;
  ExpressionEvalContext *ctx_local;
  ArrayView<ExprBase_*> arguments_local;
  
  ctx_local = (ExpressionEvalContext *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  local_38 = context;
  context_local = &expression->super_ExprBase;
  expression_local = (ExprFunctionDefinition *)ctx;
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    uVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::size
                      ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                       &(expression_local->super_ExprBase).next);
    if (uVar2 < *(uint *)&expression_local[2].arguments.tail) {
      pEVar5 = &expression_local->super_ExprBase;
      this = ExpressionContext::get<ExpressionEvalContext::StackFrame>
                       ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
      ExpressionEvalContext::StackFrame::StackFrame
                (this,(Allocator *)(expression_local->super_ExprBase)._vptr_ExprBase[0x114a],
                 (FunctionData *)context_local[1]._vptr_ExprBase);
      frame = this;
      SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::push_back
                ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)&pEVar5->next,&frame);
      ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                          ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                           &(expression_local->super_ExprBase).next);
      curr = (ExprVariableDefinition *)*ppSVar3;
      storage = *(ExprPointerLiteral **)&context_local[1].typeID;
      if (storage != (ExprPointerLiteral *)0x0) {
        local_58 = AllocateTypeStorage((ExpressionEvalContext *)expression_local,
                                       (storage->super_ExprBase).source,
                                       *(TypeBase **)(*(long *)(storage->ptr + 8) + 0x20));
        if (local_58 == (ExprPointerLiteral *)0x0) {
          return (ExprBase *)0x0;
        }
        pEVar5 = &curr->super_ExprBase;
        ExpressionEvalContext::StackVariable::StackVariable
                  ((StackVariable *)local_68,*(VariableData **)(storage->ptr + 8),local_58);
        SmallArray<ExpressionEvalContext::StackVariable,_32U>::push_back
                  ((SmallArray<ExpressionEvalContext::StackVariable,_32U> *)&pEVar5->typeID,
                   (StackVariable *)local_68);
        bVar1 = CreateStore((ExpressionEvalContext *)expression_local,&local_58->super_ExprBase,
                            local_38);
        if (!bVar1) {
          return (ExprBase *)0x0;
        }
      }
      curr_1._4_4_ = 0;
      for (storage_1 = (ExprPointerLiteral *)context_local[1].source;
          storage_1 != (ExprPointerLiteral *)0x0;
          storage_1 = (ExprPointerLiteral *)
                      getType<ExprVariableDefinition>((storage_1->super_ExprBase).next)) {
        local_80 = AllocateTypeStorage((ExpressionEvalContext *)expression_local,
                                       (storage_1->super_ExprBase).source,
                                       *(TypeBase **)(*(long *)(storage_1->ptr + 8) + 0x20));
        if (local_80 == (ExprPointerLiteral *)0x0) {
          return (ExprBase *)0x0;
        }
        pEVar5 = &curr->super_ExprBase;
        ExpressionEvalContext::StackVariable::StackVariable
                  ((StackVariable *)&jmpOffset,*(VariableData **)(storage_1->ptr + 8),local_80);
        SmallArray<ExpressionEvalContext::StackVariable,_32U>::push_back
                  ((SmallArray<ExpressionEvalContext::StackVariable,_32U> *)&pEVar5->typeID,
                   (StackVariable *)&jmpOffset);
        ctx_00 = expression_local;
        target = local_80;
        ppEVar4 = ArrayView<ExprBase_*>::operator[]
                            ((ArrayView<ExprBase_*> *)&ctx_local,curr_1._4_4_);
        bVar1 = CreateStore((ExpressionEvalContext *)ctx_00,&target->super_ExprBase,*ppEVar4);
        if (!bVar1) {
          return (ExprBase *)0x0;
        }
        curr_1._4_4_ = curr_1._4_4_ + 1;
      }
      if (context_local[1].next != (ExprBase *)0x0) {
        pEVar5 = Evaluate((ExpressionEvalContext *)expression_local,context_local[1].next);
        pEVar6 = getType<ExprIntegerLiteral>(pEVar5);
        if (pEVar6 == (ExprIntegerLiteral *)0x0) {
          return (ExprBase *)0x0;
        }
        *(int *)&curr[8].super_ExprBase.listed = (int)pEVar6->value;
      }
      for (result = *(ExprBase **)&context_local[1].listed; result != (ExprBase *)0x0;
          result = result->next) {
        pEVar5 = Evaluate((ExpressionEvalContext *)expression_local,result);
        if (pEVar5 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        bVar1 = false;
        if (*(int *)&curr[8].super_ExprBase.field_0x2c == 0) {
          bVar1 = *(int *)&curr[8].variable == 0;
        }
        if (!bVar1) {
          __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,2000,
                        "ExprBase *EvaluateFunction(ExpressionEvalContext &, ExprFunctionDefinition *, ExprBase *, ArrayView<ExprBase *>)"
                       );
        }
        if (curr[8].super_ExprBase.next != (ExprBase *)0x0) break;
      }
      pEVar5 = curr[8].super_ExprBase.next;
      if (pEVar5 == (ExprBase *)0x0) {
        arguments_local._8_8_ =
             ReportCritical((ExpressionEvalContext *)expression_local,
                            "ERROR: function didn\'t return a value");
      }
      else {
        SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::pop_back
                  ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                   &(expression_local->super_ExprBase).next);
        arguments_local._8_8_ = pEVar5;
      }
    }
    else {
      arguments_local._8_8_ =
           Report((ExpressionEvalContext *)expression_local,"ERROR: stack depth limit");
    }
  }
  else {
    arguments_local.count = 0;
    arguments_local._12_4_ = 0;
  }
  return (ExprBase *)arguments_local._8_8_;
}

Assistant:

ExprBase* EvaluateFunction(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression, ExprBase *context, ArrayView<ExprBase*> arguments)
{
	if(!AddInstruction(ctx))
		return NULL;

	if(ctx.stackFrames.size() >= ctx.stackDepthLimit)
		return Report(ctx, "ERROR: stack depth limit");

	ctx.stackFrames.push_back(new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, expression->function));

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(ExprVariableDefinition *curr = expression->contextArgument)
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, context))
			return NULL;
	}

	unsigned pos = 0;

	for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, arguments[pos]))
			return NULL;

		pos++;
	}

	if(expression->coroutineStateRead)
	{
		if(ExprIntegerLiteral *jmpOffset = getType<ExprIntegerLiteral>(Evaluate(ctx, expression->coroutineStateRead)))
		{
			frame->targetYield = unsigned(jmpOffset->value);
		}
		else
		{
			return NULL;
		}
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			break;
	}

	ExprBase *result = frame->returnValue;

	if(!result)
		return ReportCritical(ctx, "ERROR: function didn't return a value");

	ctx.stackFrames.pop_back();

	return result;
}